

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O3

int LZ4_decompress_fast(char *source,char *dest,int originalSize)

{
  uint *puVar1;
  uint *puVar2;
  char cVar3;
  ushort uVar4;
  ushort uVar5;
  BYTE *s;
  char *pcVar6;
  uint *puVar7;
  char *pcVar8;
  ulong uVar9;
  uint *puVar10;
  BYTE *oCopyLimit;
  BYTE *d_1;
  uint uVar11;
  size_t __n;
  ushort *__src;
  ushort *puVar12;
  uint *puVar13;
  char *local_38;
  
  if (originalSize == 0) {
    uVar11 = -(uint)(*source != '\0') | 1;
  }
  else {
    puVar2 = (uint *)(dest + originalSize);
    puVar13 = (uint *)(dest + (long)originalSize + -0xc);
    puVar1 = (uint *)((long)puVar2 - 7);
    __src = (ushort *)source;
    while( true ) {
      uVar4 = *__src;
      __src = (ushort *)((long)__src + 1);
      uVar11 = (uint)(byte)((byte)uVar4 >> 4);
      __n = (size_t)uVar11;
      if (uVar11 == 0xf) {
        __n = 0xf;
        do {
          uVar5 = *__src;
          __src = (ushort *)((long)__src + 1);
          __n = __n + (byte)uVar5;
        } while ((ulong)(byte)uVar5 == 0xff);
      }
      puVar10 = (uint *)((long)dest + __n);
      puVar12 = __src;
      if (puVar2 + -2 < puVar10) break;
      do {
        *(undefined8 *)dest = *(undefined8 *)puVar12;
        dest = (char *)((long)dest + 8);
        puVar12 = puVar12 + 4;
      } while (dest < puVar10);
      puVar12 = (ushort *)((long)__src + __n);
      __src = puVar12 + 1;
      uVar5 = *puVar12;
      *puVar10 = (uint)uVar5;
      uVar9 = (ulong)((byte)uVar4 & 0xf);
      if (uVar9 == 0xf) {
        uVar9 = 0xf;
        do {
          uVar4 = *__src;
          __src = (ushort *)((long)__src + 1);
          uVar9 = uVar9 + (byte)uVar4;
        } while ((ulong)(byte)uVar4 == 0xff);
      }
      if (uVar5 < 8) {
        LZ4_decompress_fast_cold_1();
        pcVar6 = local_38;
      }
      else {
        *(undefined8 *)puVar10 = *(undefined8 *)((long)puVar10 - (ulong)uVar5);
        pcVar6 = (char *)((undefined8 *)((long)puVar10 - (ulong)uVar5) + 1);
      }
      dest = (char *)((long)puVar10 + uVar9 + 4);
      puVar7 = puVar10 + 2;
      if (puVar13 < dest) {
        if ((uint *)((long)puVar2 - 5U) < dest) goto LAB_0010a598;
        pcVar8 = pcVar6;
        puVar10 = puVar7;
        if (puVar7 < puVar1) {
          do {
            *(undefined8 *)puVar10 = *(undefined8 *)pcVar8;
            puVar10 = puVar10 + 2;
            pcVar8 = pcVar8 + 8;
          } while (puVar10 < puVar1);
          pcVar6 = pcVar6 + ((long)puVar1 - (long)puVar7);
          puVar7 = puVar1;
        }
        for (; puVar7 < dest; puVar7 = (uint *)((long)puVar7 + 1)) {
          cVar3 = *pcVar6;
          pcVar6 = pcVar6 + 1;
          *(char *)puVar7 = cVar3;
        }
      }
      else {
        *(undefined8 *)puVar7 = *(undefined8 *)pcVar6;
        if (0x10 < uVar9 + 4) {
          puVar10 = puVar10 + 4;
          do {
            pcVar6 = pcVar6 + 8;
            *(undefined8 *)puVar10 = *(undefined8 *)pcVar6;
            puVar10 = puVar10 + 2;
          } while (puVar10 < dest);
        }
      }
    }
    if (puVar10 == puVar2) {
      memcpy(dest,__src,__n);
      return ((int)__src + (int)__n) - (int)source;
    }
LAB_0010a598:
    uVar11 = ~(uint)__src + (int)source;
  }
  return uVar11;
}

Assistant:

int LZ4_decompress_fast(const char* source, char* dest, int originalSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize, endOnOutputSize, full, 0, withPrefix64k, (BYTE*)(dest - 64 KB), NULL, 64 KB);
}